

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseModule
          (WastParser *this,unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *out_module
          )

{
  __single_object __p;
  bool bVar1;
  Result RVar2;
  TokenTypePair pair;
  Enum EVar3;
  long lVar4;
  allocator<char> local_92;
  allocator<char> local_91;
  __single_object module;
  _Head_base<0UL,_wabt::Command_*,_false> local_88 [4];
  string local_68 [32];
  long *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  std::make_unique<wabt::Module>();
  bVar1 = PeekMatchLpar(this,Module);
  EVar3 = Error;
  if (bVar1) {
    local_88[0]._M_head_impl = (Command *)0x0;
    RVar2 = ParseModuleCommand(this,(Script *)0x0,(CommandPtr *)local_88);
    if (RVar2.enum_ != Error) {
      if ((local_88[0]._M_head_impl)->type == ScriptModule) {
        cast<wabt::ScriptModuleCommand,wabt::Command>
                  ((wabt *)&local_48,
                   (unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_> *)local_88);
      }
      else {
        if ((local_88[0]._M_head_impl)->type != First) {
          __assert_fail("isa<ScriptModuleCommand>(command.get())",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                        ,0x48d,"Result wabt::WastParser::ParseModule(std::unique_ptr<Module> *)");
        }
        cast<wabt::ModuleCommand,wabt::Command>
                  ((wabt *)&local_48,
                   (unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_> *)local_88);
      }
      Module::operator=((Module *)
                        module._M_t.
                        super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t
                        .super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                        super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl,
                        (Module *)(local_48 + 2));
      if (local_48 != (long *)0x0) {
        (**(code **)(*local_48 + 8))();
      }
    }
    if (local_88[0]._M_head_impl != (Command *)0x0) {
      (*(local_88[0]._M_head_impl)->_vptr_Command[1])();
    }
joined_r0x0012d92b:
    if (RVar2.enum_ == Error) goto LAB_0012da3d;
  }
  else {
    pair = PeekPair(this);
    bVar1 = anon_unknown_1::IsModuleField(pair);
    if (bVar1) {
      RVar2 = ParseModuleFieldList
                        (this,(Module *)
                              module._M_t.
                              super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>
                              .super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl);
      goto joined_r0x0012d92b;
    }
    ConsumeIfLpar(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,"a module field",&local_91);
    std::__cxx11::string::string<std::allocator<char>>(local_68,"a module",&local_92);
    local_48 = (long *)0x0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               (string *)local_88,&local_48);
    ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_48,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    lVar4 = 0x20;
    do {
      std::__cxx11::string::_M_dispose();
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
  }
  RVar2 = Expect(this,Eof);
  __p = module;
  if ((RVar2.enum_ != Error) &&
     ((this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_start)) {
    module._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
    super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::Module,_std::default_delete<wabt::Module>,_true,_true>)
         (__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>)0x0;
    std::__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>::reset
              ((__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_> *)out_module,
               (pointer)__p._M_t.
                        super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t
                        .super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                        super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl);
    EVar3 = Ok;
  }
LAB_0012da3d:
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr(&module);
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseModule(std::unique_ptr<Module>* out_module) {
  WABT_TRACE(ParseModule);
  auto module = std::make_unique<Module>();

  if (PeekMatchLpar(TokenType::Module)) {
    // Starts with "(module". Allow text and binary modules, but no quoted
    // modules.
    CommandPtr command;
    CHECK_RESULT(ParseModuleCommand(nullptr, &command));
    if (isa<ModuleCommand>(command.get())) {
      auto module_command = cast<ModuleCommand>(std::move(command));
      *module = std::move(module_command->module);
    } else {
      assert(isa<ScriptModuleCommand>(command.get()));
      auto module_command = cast<ScriptModuleCommand>(std::move(command));
      *module = std::move(module_command->module);
    }
  } else if (IsModuleField(PeekPair())) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    CHECK_RESULT(ParseModuleFieldList(module.get()));
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a module"});
  }

  EXPECT(Eof);
  if (errors_->size() == 0) {
    *out_module = std::move(module);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}